

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_ASCIIHexDecode.hh
# Opt level: O0

Pipeline * __thiscall SF_ASCIIHexDecode::getDecodePipeline(SF_ASCIIHexDecode *this,Pipeline *next)

{
  element_type *peVar1;
  shared_ptr<Pl_ASCIIHexDecoder> local_28;
  Pipeline *local_18;
  Pipeline *next_local;
  SF_ASCIIHexDecode *this_local;
  
  local_18 = next;
  next_local = (Pipeline *)this;
  std::make_shared<Pl_ASCIIHexDecoder,char_const(&)[16],Pipeline*&>
            ((char (*) [16])&local_28,(Pipeline **)"asciiHex decode");
  std::shared_ptr<Pipeline>::operator=(&this->pipeline,&local_28);
  std::shared_ptr<Pl_ASCIIHexDecoder>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  return peVar1;
}

Assistant:

Pipeline*
    getDecodePipeline(Pipeline* next) override
    {
        this->pipeline = std::make_shared<Pl_ASCIIHexDecoder>("asciiHex decode", next);
        return this->pipeline.get();
    }